

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O0

bool __thiscall Jinx::Variant::GetBoolean(Variant *this)

{
  bool bVar1;
  undefined1 local_40 [8];
  Variant v;
  Variant *this_local;
  
  v.field_1._24_8_ = this;
  bVar1 = IsBoolean(this);
  if (bVar1) {
    this_local._7_1_ = (bool)((this->field_1).m_boolean & 1);
  }
  else {
    Variant((Variant *)local_40,this);
    bVar1 = ConvertTo((Variant *)local_40,Boolean);
    if (bVar1) {
      this_local._7_1_ = GetBoolean((Variant *)local_40);
    }
    else {
      this_local._7_1_ = false;
    }
    ~Variant((Variant *)local_40);
  }
  return this_local._7_1_;
}

Assistant:

inline bool Variant::GetBoolean() const
	{
		if (IsBoolean())
			return m_boolean;
		Variant v = *this;
		if (!v.ConvertTo(ValueType::Boolean))
			return false;
		return v.GetBoolean();
	}